

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_datadir::test_method(util_datadir *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  path *ppVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  allocator<char> local_311;
  path local_310;
  string local_2e8;
  undefined1 local_2c8 [32];
  path dd_norm;
  ArgsManager args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dd_norm,"-datadir",(allocator<char> *)local_2c8);
  std::filesystem::__cxx11::path::string
            (&local_310._M_pathname,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path);
  ArgsManager::ForceSetArg(&args,(string *)&dd_norm,&local_310._M_pathname);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&dd_norm);
  ArgsManager::GetDataDirBase(&dd_norm,&args);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-datadir",&local_311);
  std::filesystem::__cxx11::path::string(&local_2e8,&dd_norm.super_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 &local_2e8,"/");
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_2c8);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_310);
  ArgsManager::ClearPathCache(&args);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_338,msg);
  local_2c8[8] = 0;
  local_2c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_340 = "";
  ArgsManager::GetDataDirBase((path *)&local_310,&args);
  pvVar2 = (iterator)0x2;
  ppVar3 = &dd_norm;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_2c8,&local_348,0x25,1,2,ppVar3,"dd_norm",&local_310,"args.GetDataDirBase()");
  std::filesystem::__cxx11::path::~path(&local_310);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-datadir",&local_311);
  std::filesystem::__cxx11::path::string(&local_2e8,&dd_norm.super_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 &local_2e8,"/.");
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_2c8);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_310);
  ArgsManager::ClearPathCache(&args);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)ppVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x29;
  file_00.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_368,
             msg_00);
  local_2c8[8] = 0;
  local_2c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_370 = "";
  ArgsManager::GetDataDirBase((path *)&local_310,&args);
  pvVar2 = (iterator)0x2;
  ppVar3 = &dd_norm;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_2c8,&local_378,0x29,1,2,ppVar3,"dd_norm",&local_310,"args.GetDataDirBase()");
  std::filesystem::__cxx11::path::~path(&local_310);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-datadir",&local_311);
  std::filesystem::__cxx11::path::string(&local_2e8,&dd_norm.super_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 &local_2e8,"/./");
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_2c8);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_310);
  ArgsManager::ClearPathCache(&args);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)ppVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x2d;
  file_01.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_398,
             msg_01);
  local_2c8[8] = 0;
  local_2c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3a0 = "";
  ArgsManager::GetDataDirBase((path *)&local_310,&args);
  pvVar2 = (iterator)0x2;
  ppVar3 = &dd_norm;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_2c8,&local_3a8,0x2d,1,2,ppVar3,"dd_norm",&local_310,"args.GetDataDirBase()");
  std::filesystem::__cxx11::path::~path(&local_310);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-datadir",&local_311);
  std::filesystem::__cxx11::path::string(&local_2e8,&dd_norm.super_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 &local_2e8,"/.//");
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_2c8);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_310);
  ArgsManager::ClearPathCache(&args);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)ppVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x31;
  file_02.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3c8,
             msg_02);
  local_2c8[8] = 0;
  local_2c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0 = "";
  ArgsManager::GetDataDirBase((path *)&local_310,&args);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_2c8,&local_3d8,0x31,1,2,&dd_norm,"dd_norm",&local_310,"args.GetDataDirBase()");
  std::filesystem::__cxx11::path::~path(&local_310);
  std::filesystem::__cxx11::path::~path(&dd_norm.super_path);
  ArgsManager::~ArgsManager(&args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_datadir)
{
    // Use local args variable instead of m_args to avoid making assumptions about test setup
    ArgsManager args;
    args.ForceSetArg("-datadir", fs::PathToString(m_path_root));

    const fs::path dd_norm = args.GetDataDirBase();

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/.");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/./");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/.//");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());
}